

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::initialize_Z(OjaNewton *this,parameters *weights)

{
  sparse_parameters *psVar1;
  _func_void_weight_ptr_void_ptr *p_Var2;
  bool bVar3;
  OjaNewton *pOVar4;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  byte bVar5;
  int iVar6;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var7;
  weight *pwVar8;
  uint32_t i_1;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint32_t i;
  ulong uVar12;
  float fVar13;
  weight wVar14;
  double dVar15;
  uint64_t index;
  ulong local_80;
  ulong local_78;
  float *local_70;
  OjaNewton *local_68;
  double local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ulong local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar9 = 1L << ((byte)this->all->num_bits & 0x3f);
  local_68 = this;
  if (this->normalize == true) {
    psVar1 = &weights->sparse_weights;
    uVar12 = 0;
    do {
      if (weights->sparse == true) {
        local_80 = uVar12 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var7._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_80);
        if (_Var7._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_78);
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar8 = *(weight **)
                  ((long)&((_Var7._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar8 = (weights->dense_weights)._begin +
                 (uVar12 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      pwVar8[(long)local_68->m + 1] = 0.1;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  pOVar4 = local_68;
  local_40 = uVar9 & 0xffffffff;
  if (local_68->random_init == false) {
    if (local_68->m < 1) {
      return;
    }
    psVar1 = &weights->sparse_weights;
    lVar10 = 1;
    do {
      if (weights->sparse == true) {
        local_80 = lVar10 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var7._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,&local_80);
        if (_Var7._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_78);
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar8 = *(weight **)
                  ((long)&((_Var7._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar8 = (weights->dense_weights)._begin +
                 (lVar10 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      pwVar8[lVar10] = 1.0;
      iVar6 = pOVar4->m;
      bVar3 = lVar10 < iVar6;
      lVar10 = lVar10 + 1;
    } while (bVar3);
  }
  else {
    local_38 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&weights->sparse_weights;
    uVar9 = 0;
    do {
      if (weights->sparse == true) {
        local_80 = uVar9 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                   (weights->sparse_weights)._weight_mask;
        _Var7._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_38,&local_80);
        if (_Var7._M_cur == (__node_type *)0x0) {
          local_70 = calloc_or_throw<float>
                               (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
          this_00 = local_38;
          local_78 = local_80;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_38,&local_78);
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(this_00,&local_80);
          p_Var2 = (weights->sparse_weights).fun;
          if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),(weights->sparse_weights).default_data
                     );
          }
        }
        pwVar8 = *(weight **)
                  ((long)&((_Var7._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                          _M_storage._M_storage + 8);
      }
      else {
        pwVar8 = (weights->dense_weights)._begin +
                 (uVar9 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      iVar6 = local_68->m;
      if (0 < iVar6) {
        pOVar4 = local_68;
        lVar10 = 1;
        do {
          do {
            fVar13 = merand48(&pOVar4->all->random_state);
            local_58 = (double)CONCAT44(local_58._4_4_,fVar13);
            fVar13 = merand48(&pOVar4->all->random_state);
          } while ((float)local_58 == 0.0);
          local_60 = (double)CONCAT44(local_60._4_4_,fVar13);
          fVar13 = logf((float)local_58);
          fVar13 = fVar13 * -2.0;
          if (fVar13 < 0.0) {
            fVar13 = sqrtf(fVar13);
          }
          else {
            fVar13 = SQRT(fVar13);
          }
          local_58 = (double)CONCAT44(local_58._4_4_,fVar13);
          dVar15 = cos((double)local_60._0_4_ * 6.2831854820251465);
          pwVar8[lVar10] = (float)dVar15 * (float)local_58;
          iVar6 = local_68->m;
          bVar3 = lVar10 < iVar6;
          pOVar4 = local_68;
          lVar10 = lVar10 + 1;
        } while (bVar3);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_40);
  }
  if (0 < iVar6) {
    psVar1 = &weights->sparse_weights;
    uVar9 = 1;
    do {
      if (1 < uVar9) {
        uVar12 = 1;
        do {
          local_58 = 0.0;
          uVar11 = 0;
          do {
            bVar5 = weights->sparse;
            if ((bool)bVar5 == true) {
              local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var7._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var7._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar8 = *(weight **)
                        ((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              bVar5 = weights->sparse;
            }
            else {
              pwVar8 = (weights->dense_weights)._begin +
                       (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            dVar15 = (double)pwVar8[uVar9];
            if ((bVar5 & 1) == 0) {
              pwVar8 = (weights->dense_weights)._begin +
                       (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            else {
              local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              local_60 = dVar15;
              _Var7._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var7._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar8 = *(weight **)
                        ((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              dVar15 = local_60;
            }
            local_58 = local_58 + dVar15 * (double)pwVar8[uVar12];
            uVar11 = uVar11 + 1;
          } while (local_40 != uVar11);
          local_58 = (double)CONCAT44(0x80000000,-(float)local_58);
          uStack_50 = 0x80000000;
          uStack_4c = 0x80000000;
          uVar11 = 0;
          do {
            bVar5 = weights->sparse;
            if ((bool)bVar5 == true) {
              local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var7._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var7._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar8 = *(weight **)
                        ((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              bVar5 = weights->sparse;
            }
            else {
              pwVar8 = (weights->dense_weights)._begin +
                       (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            wVar14 = pwVar8[uVar12];
            if ((bVar5 & 1) == 0) {
              pwVar8 = (weights->dense_weights)._begin +
                       (uVar11 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            else {
              local_60 = (double)CONCAT44(local_60._4_4_,wVar14);
              local_80 = uVar11 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                         (weights->sparse_weights)._weight_mask;
              _Var7._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_80);
              if (_Var7._M_cur == (__node_type *)0x0) {
                local_70 = calloc_or_throw<float>
                                     (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
                local_78 = local_80;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)psVar1,&local_78);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)psVar1,&local_80);
                p_Var2 = (weights->sparse_weights).fun;
                if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                            (weights->sparse_weights).default_data);
                }
              }
              pwVar8 = *(weight **)
                        ((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
              wVar14 = local_60._0_4_;
            }
            pwVar8[uVar9] = wVar14 * (float)local_58 + pwVar8[uVar9];
            uVar11 = uVar11 + 1;
          } while (local_40 != uVar11);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      dVar15 = 0.0;
      uVar12 = 0;
      do {
        bVar5 = weights->sparse;
        local_58 = dVar15;
        if ((bool)bVar5 == true) {
          local_80 = uVar12 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var7._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var7._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar8 = *(weight **)
                    ((long)&((_Var7._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          bVar5 = weights->sparse;
        }
        else {
          pwVar8 = (weights->dense_weights)._begin +
                   (uVar12 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        dVar15 = (double)pwVar8[uVar9];
        if ((bVar5 & 1) == 0) {
          pwVar8 = (weights->dense_weights)._begin +
                   (uVar12 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        else {
          local_80 = uVar12 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          local_60 = dVar15;
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var7._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var7._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar8 = *(weight **)
                    ((long)&((_Var7._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          dVar15 = local_60;
        }
        dVar15 = local_58 + dVar15 * (double)pwVar8[uVar9];
        uVar12 = uVar12 + 1;
      } while (local_40 != uVar12);
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      pOVar4 = local_68;
      fVar13 = (float)dVar15;
      uVar12 = 0;
      local_58 = (double)CONCAT44(local_58._4_4_,fVar13);
      do {
        if (weights->sparse == true) {
          local_80 = uVar12 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f) &
                     (weights->sparse_weights)._weight_mask;
          _Var7._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_80);
          if (_Var7._M_cur == (__node_type *)0x0) {
            local_70 = calloc_or_throw<float>
                                 (1L << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
            local_78 = local_80;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_78);
            _Var7._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_80);
            p_Var2 = (weights->sparse_weights).fun;
            if (p_Var2 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var2)(*(weight **)((long)_Var7._M_cur + 0x10),
                        (weights->sparse_weights).default_data);
            }
          }
          pwVar8 = *(weight **)
                    ((long)&((_Var7._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          fVar13 = (float)local_58;
        }
        else {
          pwVar8 = (weights->dense_weights)._begin +
                   (uVar12 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        pwVar8[uVar9] = pwVar8[uVar9] / fVar13;
        uVar12 = uVar12 + 1;
      } while (local_40 != uVar12);
      bVar3 = (long)uVar9 < (long)pOVar4->m;
      uVar9 = uVar9 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void initialize_Z(parameters& weights)
  {
    uint32_t length = 1 << all->num_bits;
    if (normalize)  // initialize normalization part
    {
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[NORM2] = 0.1f;
    }
    if (!random_init)
    {
      // simple initialization
      for (int i = 1; i <= m; i++) (&(weights.strided_index(i)))[i] = 1.f;
    }
    else
    {
      // more complicated initialization: orthgonal basis of a random matrix

      const double PI2 = 2.f * 3.1415927f;

      for (uint32_t i = 0; i < length; i++)
      {
        weight& w = weights.strided_index(i);
        float r1, r2;
        for (int j = 1; j <= m; j++)
        {
          //box-muller tranform: https://en.wikipedia.org/wiki/Box%E2%80%93Muller_transform
          //redraw until r1 should be strictly positive
          do
          {
            r1 = merand48(all->random_state);
            r2 = merand48(all->random_state);
          } while (r1 == 0.f);

          (&w)[j] = sqrt(-2.f * log(r1)) * (float)cos(PI2 * r2);
        }
      }
    }

    // Gram-Schmidt
    for (int j = 1; j <= m; j++)
    {
      for (int k = 1; k <= j - 1; k++)
      {
        double tmp = 0;

        for (uint32_t i = 0; i < length; i++)
          tmp += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[k];
        for (uint32_t i = 0; i < length; i++)
          (&(weights.strided_index(i)))[j] -= (float)tmp * (&(weights.strided_index(i)))[k];
      }
      double norm = 0;
      for (uint32_t i = 0; i < length; i++)
        norm += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[j];
      norm = sqrt(norm);
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[j] /= (float)norm;
    }
  }